

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

void mg_send_mime_file2(mg_connection *conn,char *path,char *mime_type,char *additional_headers)

{
  byte bVar1;
  mg_domain_context *pmVar2;
  size_t dst_len;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  __int32_t **pp_Var12;
  DIR *__dirp;
  dirent64 *pdVar13;
  ptrdiff_t pVar14;
  int *piVar15;
  undefined8 *puVar16;
  undefined8 *__ptr;
  size_t sVar17;
  char *pcVar18;
  long lVar19;
  undefined8 *puVar20;
  size_t sVar21;
  tm *__tp;
  bool bVar22;
  int iVar23;
  mg_match_context *mcx;
  mg_file_stat *filep;
  char *func;
  mg_context *ctx;
  time_t *t;
  char *pcVar24;
  char *pcVar25;
  undefined8 *puVar26;
  undefined8 *puVar27;
  de *a;
  char *pcVar28;
  ulong uVar29;
  undefined8 *puVar30;
  ulong uVar31;
  ulong uVar32;
  double dVar33;
  undefined1 auVar34 [16];
  ulong local_1170;
  ulong local_1168;
  int local_1154;
  undefined8 *local_1150;
  undefined8 *local_1148;
  ulong local_1140;
  ulong local_1138;
  undefined8 *local_1130;
  undefined8 *local_1128;
  long local_1120;
  ulong local_1118;
  ulong local_1110;
  long local_1108;
  ulong local_1100;
  char *local_10f8;
  time_t local_10f0;
  mg_file file;
  de de;
  char date [64];
  char path_1 [4096];
  
  file.stat.is_directory = 0;
  file.stat.is_gzipped = 0;
  file.stat.location = 0;
  file.stat._28_4_ = 0;
  file.stat.size = 0;
  file.stat.last_modified = 0;
  file.access.fp = (FILE *)0x0;
  if (conn == (mg_connection *)0x0) {
    return;
  }
  iVar10 = mg_stat((mg_connection *)path,(char *)&file,(mg_file_stat *)mime_type);
  if (iVar10 == 0) {
    pcVar25 = "Error: File not found";
    iVar10 = 0x194;
  }
  else {
    if (file.stat.is_directory == 0) {
      handle_static_file_request(conn,path,&file,mime_type,additional_headers);
      return;
    }
    pcVar25 = conn->dom_ctx->config[0x21];
    pp_Var12 = __ctype_tolower_loc();
    mcx = (mg_match_context *)0x0;
    do {
      bVar1 = pcVar25[(long)mcx];
      iVar10 = (*pp_Var12)[bVar1];
      iVar11 = (*pp_Var12)[*(byte *)((long)&mcx[0x915].match[0xd].str + 7)];
      if (bVar1 == 0) break;
      mcx = (mg_match_context *)((long)&mcx->case_sensitive + 1);
    } while (iVar10 == iVar11);
    if (iVar10 == iVar11) {
      local_10f0 = time((time_t *)0x0);
      __dirp = opendir(path);
      if (__dirp == (DIR *)0x0) {
        piVar15 = __errno_location();
        pcVar25 = strerror(*piVar15);
        mg_send_http_error(conn,500,"Error: Cannot open directory\nopendir(%s): %s",path,pcVar25);
        return;
      }
      pdVar13 = readdir64(__dirp);
      if (pdVar13 == (dirent64 *)0x0) {
        local_1170 = 0;
        __ptr = (undefined8 *)0x0;
      }
      else {
        local_1168 = 0x80;
        local_1170 = 0;
        __ptr = (undefined8 *)0x0;
        do {
          if ((pdVar13->d_name[0] != '.') ||
             ((pdVar13->d_name[1] != '\0' &&
              ((pdVar13->d_name[1] != '.' || (pdVar13->d_name[2] != '\0')))))) {
            pcVar25 = pdVar13->d_name;
            pmVar2 = conn->dom_ctx;
            if ((pmVar2 == (mg_domain_context *)0x0) ||
               ((pVar14 = mg_match_alternatives("**.htpasswd$",0xc,pcVar25,mcx), pVar14 < 1 &&
                (pVar14 = match_prefix_strlen(pmVar2->config[0x2a],pcVar25), pVar14 < 1)))) {
              mcx = (mg_match_context *)0x1000;
              mg_snprintf(conn,&local_1154,path_1,0x1000,"%s/%s",path,pcVar25);
              de.file.is_directory = 0;
              de.file.is_gzipped = 0;
              de.file.location = 0;
              de.file._28_4_ = 0;
              de.file.size = 0;
              de.file.last_modified = 0;
              if (local_1154 == 0) {
                iVar10 = mg_stat((mg_connection *)path_1,(char *)&de.file,filep);
                if (iVar10 == 0) {
                  piVar15 = __errno_location();
                  pcVar18 = strerror(*piVar15);
                  mg_cry_internal_wrap
                            (conn,(mg_context *)0x0,func,(uint)pcVar18,"%s: mg_stat(%s) failed: %s",
                             "scan_directory",(mg_connection *)path_1,pcVar18);
                }
                de.file_name = pcVar25;
                if (__ptr == (undefined8 *)0x0) {
                  puVar16 = (undefined8 *)malloc(local_1168 * 0x50);
LAB_0011056a:
                  if (puVar16 == (undefined8 *)0x0) break;
                  local_1168 = local_1168 * 2;
                  __ptr = puVar16;
                }
                else if (local_1168 <= local_1170) {
                  puVar16 = (undefined8 *)realloc(__ptr,local_1168 * 0x50);
                  goto LAB_0011056a;
                }
                pcVar25 = de.file_name;
                sVar17 = strlen(de.file_name);
                pcVar25 = mg_strndup_ctx(pcVar25,sVar17,ctx);
                mcx = (mg_match_context *)(local_1170 * 5);
                __ptr[local_1170 * 5] = pcVar25;
                if (pcVar25 == (char *)0x0) break;
                __ptr[local_1170 * 5 + 3] = de.file._16_8_;
                (__ptr + local_1170 * 5 + 3)[1] = de.file._24_8_;
                __ptr[local_1170 * 5 + 1] = de.file.size;
                (__ptr + local_1170 * 5 + 1)[1] = de.file.last_modified;
                local_1170 = local_1170 + 1;
              }
            }
          }
          pdVar13 = readdir64(__dirp);
        } while (pdVar13 != (dirent64 *)0x0);
      }
      closedir(__dirp);
      gmt_time_string(date,(size_t)&local_10f0,t);
      pcVar25 = (conn->request_info).local_uri;
      sVar17 = strcspn(pcVar25,"&<>");
      if (pcVar25[sVar17] == '\0') {
        pcVar18 = (char *)0x0;
      }
      else {
        sVar17 = strlen(pcVar25);
        pcVar18 = (char *)malloc(sVar17 * 5 + 1);
        if (pcVar18 == (char *)0x0) {
          pcVar25 = "";
          pcVar18 = (char *)0x0;
        }
        else {
          cVar9 = *pcVar25;
          pcVar24 = pcVar25;
          pcVar28 = pcVar18;
          while (cVar9 != '\0') {
            pcVar24 = pcVar24 + 1;
            *pcVar28 = cVar9;
            pcVar28[1] = '\0';
            if (cVar9 == '>') {
              builtin_strncpy(pcVar28,"&gt;",5);
            }
            else if (cVar9 == '<') {
              builtin_strncpy(pcVar28,"&lt;",5);
            }
            else if (cVar9 == '&') {
              builtin_strncpy(pcVar28,"&amp;",6);
            }
            sVar17 = strlen(pcVar28);
            pcVar28 = pcVar28 + sVar17;
            cVar9 = *pcVar24;
          }
        }
      }
      pcVar24 = (conn->request_info).query_string;
      uVar29 = 100;
      if ((pcVar24 != (char *)0x0) && (*pcVar24 != '\0')) {
        uVar29 = (ulong)((uint)(pcVar24[1] != 'd') * 3 + 0x61);
      }
      conn->must_close = 1;
      mg_response_header_start(conn,200);
      send_no_cache_header(conn);
      pcVar24 = conn->dom_ctx->config[0x38];
      if ((pcVar24 != (char *)0x0) && (*pcVar24 != '\0')) {
        mg_response_header_add_lines(conn,pcVar24);
      }
      mg_response_header_add(conn,"Content-Type","text/html; charset=utf-8",-1);
      mg_response_header_send(conn);
      if (pcVar18 != (char *)0x0) {
        pcVar25 = pcVar18;
      }
      mg_printf(conn,
                "<!DOCTYPE html><html><head><title>Index of %s</title><style>th {text-align: left;}</style></head><body><h1>Index of %s</h1><pre><table cellpadding=\"0\"><tr><th><a href=\"?n%c\">Name</a></th><th><a href=\"?d%c\">Modified</a></th><th><a href=\"?s%c\">Size</a></th></tr><tr><td colspan=\"3\"><hr></td></tr>"
                ,pcVar25,pcVar25,uVar29,uVar29,uVar29);
      free(pcVar18);
      mg_printf(conn,
                "<tr><td><a href=\"%s\">%s</a></td><td>&nbsp;%s</td><td>&nbsp;&nbsp;%s</td></tr>\n",
                "..","Parent directory","-","-");
      if (__ptr != (undefined8 *)0x0) {
        pcVar25 = (conn->request_info).query_string;
        local_1110 = local_1170 >> 1;
        if (pcVar25 == (char *)0x0) {
          pcVar25 = "";
        }
        lVar19 = 8;
        local_10f8 = pcVar25;
        do {
          uVar29 = *(ulong *)(&DAT_0012b5a0 + lVar19 * 8);
          local_1108 = lVar19;
          if (uVar29 <= local_1110) {
            local_1100 = uVar29 + (uVar29 == 0);
            local_1148 = __ptr + uVar29 * -5;
            uVar32 = 0;
            uVar31 = uVar32;
            puVar16 = __ptr;
            local_1150 = __ptr;
            puVar8 = local_1148;
            uVar6 = local_1138;
            puVar20 = local_1130;
            puVar7 = local_1128;
            do {
              while (local_1128 = puVar8, local_1140 = uVar31, uVar32 < local_1170) {
                pcVar18 = (char *)__ptr[uVar32 * 5];
                local_1118 = __ptr[uVar32 * 5 + 1];
                local_1120 = __ptr[uVar32 * 5 + 2];
                iVar10 = *(int *)(__ptr + uVar32 * 5 + 3);
                path_1._8_4_ = *(undefined4 *)((long)__ptr + uVar32 * 0x28 + 0x24);
                path_1._0_8_ = *(undefined8 *)((long)__ptr + uVar32 * 0x28 + 0x1c);
                puVar8 = local_1128;
                local_1138 = uVar32;
                local_1130 = puVar16;
                if (uVar32 < uVar29) {
                  puVar26 = local_1128;
                  puVar27 = puVar16;
                  puVar30 = __ptr + uVar32 * 5;
                  uVar31 = uVar32;
                  local_1138 = uVar6;
                  local_1130 = puVar20;
                  local_1128 = puVar7;
                }
                else {
                  do {
                    puVar20 = puVar8;
                    puVar26 = local_1128;
                    puVar27 = local_1130;
                    puVar30 = puVar16;
                    uVar31 = local_1138;
                    if (puVar20 == (undefined8 *)0x0) break;
                    pcVar24 = pcVar25;
                    if (*pcVar25 == '\0') {
                      pcVar24 = "n";
                    }
                    if (*(int *)(puVar20 + 3) == 0) {
                      if (iVar10 == 0) goto LAB_00110999;
                    }
                    else {
                      if (iVar10 == 0) break;
LAB_00110999:
                      if (*pcVar24 == 'd') {
                        bVar22 = local_1120 < (long)puVar20[2];
                        if (puVar20[2] != local_1120) goto LAB_001109f6;
LAB_001109b7:
                        iVar11 = strcmp((char *)*puVar20,pcVar18);
                        pcVar25 = local_10f8;
                      }
                      else {
                        if ((*pcVar24 != 's') ||
                           (bVar22 = local_1118 < (ulong)puVar20[1], puVar20[1] == local_1118))
                        goto LAB_001109b7;
LAB_001109f6:
                        iVar11 = (uint)bVar22 * 2 + -1;
                      }
                      iVar23 = -iVar11;
                      if (pcVar24[1] != 'd') {
                        iVar23 = iVar11;
                      }
                      puVar26 = local_1128;
                      puVar27 = local_1130;
                      uVar31 = local_1138;
                      if (iVar23 < 1) break;
                    }
                    uVar32 = uVar32 - uVar29;
                    puVar16[4] = puVar20[4];
                    uVar4 = *puVar20;
                    uVar5 = puVar20[1];
                    uVar3 = puVar20[3];
                    puVar16[2] = puVar20[2];
                    puVar16[3] = uVar3;
                    *puVar16 = uVar4;
                    puVar16[1] = uVar5;
                    puVar16 = puVar16 + uVar29 * -5;
                    puVar8 = puVar20 + uVar29 * -5;
                    puVar26 = local_1128;
                    puVar27 = local_1130;
                    puVar30 = puVar20;
                    uVar31 = local_1138;
                  } while (uVar29 <= uVar32);
                }
                *puVar30 = pcVar18;
                puVar30[1] = local_1118;
                puVar30[2] = local_1120;
                *(int *)(puVar30 + 3) = iVar10;
                *(undefined8 *)((long)puVar30 + 0x1c) = path_1._0_8_;
                *(undefined4 *)((long)puVar30 + 0x24) = path_1._8_4_;
                uVar32 = uVar31 + uVar29;
                uVar31 = local_1140;
                puVar16 = puVar27 + uVar29 * 5;
                puVar8 = puVar26 + uVar29 * 5;
                uVar6 = local_1138;
                puVar20 = local_1130;
                puVar7 = local_1128;
              }
              uVar32 = local_1140 + 1;
              local_1150 = local_1150 + 5;
              local_1148 = local_1148 + 5;
              local_1138 = uVar6;
              local_1130 = puVar20;
              local_1128 = puVar7;
              uVar31 = uVar32;
              puVar16 = local_1150;
              puVar8 = local_1148;
            } while (uVar32 != local_1100);
          }
          lVar19 = local_1108 + -1;
        } while (local_1108 != 0);
        if (local_1170 != 0) {
          uVar29 = 0;
          do {
            puVar16 = __ptr + uVar29 * 5;
            pcVar25 = (char *)*puVar16;
            sVar17 = strlen(pcVar25);
            sVar21 = strcspn(pcVar25,"&<>");
            lVar19 = 0;
            if (pcVar25[sVar21] != '\0') {
              lVar19 = (sVar17 + 1) * 5;
            }
            dst_len = (sVar17 + 1) * 3;
            pcVar18 = (char *)malloc(lVar19 + dst_len);
            if (pcVar18 != (char *)0x0) {
              mg_url_encode(pcVar25,pcVar18,dst_len);
              if (lVar19 == 0) {
                pcVar25 = (char *)0x0;
              }
              else {
                pcVar25 = pcVar18 + dst_len;
                pcVar24 = (char *)*puVar16;
                cVar9 = *pcVar24;
                pcVar28 = pcVar25;
                while (cVar9 != '\0') {
                  pcVar24 = pcVar24 + 1;
                  *pcVar28 = cVar9;
                  pcVar28[1] = '\0';
                  if (cVar9 == '>') {
                    builtin_strncpy(pcVar28,"&gt;",5);
                  }
                  else if (cVar9 == '<') {
                    builtin_strncpy(pcVar28,"&lt;",5);
                  }
                  else if (cVar9 == '&') {
                    builtin_strncpy(pcVar28,"&amp;",6);
                  }
                  sVar17 = strlen(pcVar28);
                  pcVar28 = pcVar28 + sVar17;
                  cVar9 = *pcVar24;
                }
              }
              if (*(int *)(puVar16 + 3) == 0) {
                uVar32 = puVar16[1];
                if (uVar32 < 0x400) {
                  mg_snprintf(conn,(int *)0x0,path_1,0x40,"%d");
                }
                else {
                  if (uVar32 < 0x100000) {
                    dVar33 = (double)(long)uVar32 * 0.0009765625;
                    pcVar24 = "%.1fk";
                  }
                  else {
                    auVar34._8_4_ = (int)(uVar32 >> 0x20);
                    auVar34._0_8_ = uVar32;
                    auVar34._12_4_ = 0x45300000;
                    dVar33 = (auVar34._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar32) - 4503599627370496.0);
                    if (uVar32 < 0x40000000) {
                      dVar33 = dVar33 * 9.5367431640625e-07;
                      pcVar24 = "%.1fM";
                    }
                    else {
                      dVar33 = dVar33 * 9.313225746154785e-10;
                      pcVar24 = "%.1fG";
                    }
                  }
                  mg_snprintf(conn,(int *)0x0,path_1,0x40,pcVar24,dVar33);
                }
              }
              else {
                mg_snprintf(conn,(int *)0x0,path_1,0x40,"%s","[DIRECTORY]");
              }
              __tp = localtime(puVar16 + 2);
              if (__tp == (tm *)0x0) {
                cVar9 = '0';
                lVar19 = 0;
                do {
                  *(char *)((long)&de.file_name + lVar19) = cVar9;
                  cVar9 = "01-Jan-1970 00:00"[lVar19 + 1];
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 0x11);
                de.file.last_modified._1_1_ = 0;
              }
              else {
                strftime((char *)&de,0x40,"%d-%b-%Y %H:%M",__tp);
              }
              pcVar24 = "/";
              if (*(int *)(puVar16 + 3) == 0) {
                pcVar24 = "";
              }
              if (pcVar25 == (char *)0x0) {
                pcVar25 = (char *)*puVar16;
              }
              mg_printf(conn,
                        "<tr><td><a href=\"%s%s\">%s%s</a></td><td>&nbsp;%s</td><td>&nbsp;&nbsp;%s</td></tr>\n"
                        ,pcVar18,pcVar24,pcVar25,pcVar24,&de,path_1);
              free(pcVar18);
            }
            free((void *)*puVar16);
            uVar29 = uVar29 + 1;
          } while (uVar29 != local_1170);
        }
        free(__ptr);
      }
      mg_printf(conn,"%s","</table></pre></body></html>");
      conn->status_code = 200;
      return;
    }
    pcVar25 = "Error: Directory listing denied";
    iVar10 = 0x193;
  }
  mg_send_http_error(conn,iVar10,"%s",pcVar25);
  return;
}

Assistant:

CIVETWEB_API void
mg_send_mime_file2(struct mg_connection *conn,
                   const char *path,
                   const char *mime_type,
                   const char *additional_headers)
{
	struct mg_file file = STRUCT_FILE_INITIALIZER;

	if (!conn) {
		/* No conn */
		return;
	}

	if (mg_stat(conn, path, &file.stat)) {
#if !defined(NO_CACHING)
		if (is_not_modified(conn, &file.stat)) {
			/* Send 304 "Not Modified" - this must not send any body data */
			handle_not_modified_static_file_request(conn, &file);
		} else
#endif /* NO_CACHING */
		    if (file.stat.is_directory) {
			if (!mg_strcasecmp(conn->dom_ctx->config[ENABLE_DIRECTORY_LISTING],
			                   "yes")) {
				handle_directory_request(conn, path);
			} else {
				mg_send_http_error(conn,
				                   403,
				                   "%s",
				                   "Error: Directory listing denied");
			}
		} else {
			handle_static_file_request(
			    conn, path, &file, mime_type, additional_headers);
		}
	} else {
		mg_send_http_error(conn, 404, "%s", "Error: File not found");
	}
}